

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_q.c
# Opt level: O0

void test_option_q(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  wchar_t in_stack_00000010;
  int r;
  char *in_stack_00000018;
  undefined4 in_stack_00000020;
  wchar_t in_stack_00000024;
  char *in_stack_00000028;
  wchar_t in_stack_00000034;
  void *in_stack_00000038;
  wchar_t in_stack_00000044;
  char *in_stack_00000048;
  char *in_stack_00000498;
  wchar_t in_stack_000004a4;
  char *in_stack_000004a8;
  char *pcVar3;
  undefined4 in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,r,in_stack_00000010,
                      in_stack_00000008);
  systemf("%s -cf archive.tar foo",testprog);
  assertion_equal_int(in_stack_00000008,unaff_retaddr,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x1142d4,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,r,in_stack_00000010,
                      in_stack_00000008);
  systemf("%s -rf archive.tar foo",testprog);
  assertion_equal_int(in_stack_00000008,unaff_retaddr,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x114344,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,r,in_stack_00000010,
                      in_stack_00000008);
  systemf("%s -rf archive.tar bar",testprog);
  assertion_equal_int(in_stack_00000008,unaff_retaddr,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x1143b4,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,r,in_stack_00000010,
                      in_stack_00000008);
  systemf("%s -rf archive.tar foo",testprog);
  assertion_equal_int(in_stack_00000008,unaff_retaddr,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x114424,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_make_file(in_stack_00000028,in_stack_00000024,in_stack_00000018,r,in_stack_00000010,
                      in_stack_00000008);
  systemf("%s -rf archive.tar bar",testprog);
  pcVar3 = (char *)0x0;
  assertion_equal_int(in_stack_00000008,unaff_retaddr,
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x114494,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  assertion_make_dir((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_stack_fffffffffffffff4,pcVar3,L'\0');
  assertion_chdir((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                  in_stack_fffffffffffffff4,pcVar3);
  wVar1 = systemf("%s -xf ../archive.tar -q foo >test.out 2>test.err",testprog);
  failure("Fatal error trying to use -q option");
  pcVar3 = (char *)0x0;
  wVar2 = assertion_equal_int(in_stack_00000008,unaff_retaddr,
                              CONCAT44(wVar1,in_stack_fffffffffffffff8),
                              (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                              0,(char *)0x114523,
                              (void *)CONCAT44(in_stack_00000024,in_stack_00000020));
  if (wVar2 != L'\0') {
    assertion_file_contents
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
               in_stack_00000028);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                    pcVar3);
    assertion_make_dir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                       pcVar3,L'\0');
    assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                    pcVar3);
    systemf("%s -xf ../archive.tar -q foo bar >test.out 2>test.err",testprog);
    pcVar3 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,CONCAT44(wVar1,in_stack_fffffffffffffff8),
                        (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                        (char *)0x114614,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_file_contents
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
               in_stack_00000028);
    assertion_file_contents
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
               in_stack_00000028);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                    pcVar3);
    assertion_make_dir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                       pcVar3,L'\0');
    assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                    pcVar3);
    systemf("%s -xf ../archive.tar --fast-read foo bar >test.out 2>test.err",testprog);
    pcVar3 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,CONCAT44(wVar1,in_stack_fffffffffffffff8),
                        (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                        (char *)0x11471f,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_file_contents
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
               in_stack_00000028);
    assertion_file_contents
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
               in_stack_00000028);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                    pcVar3);
    assertion_make_dir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                       pcVar3,L'\0');
    assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                    pcVar3);
    systemf("%s -xf ../archive.tar foo bar >test.out 2>test.err",testprog);
    pcVar3 = (char *)0x0;
    assertion_equal_int(in_stack_00000008,unaff_retaddr,CONCAT44(wVar1,in_stack_fffffffffffffff8),
                        (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                        (char *)0x11482a,(void *)CONCAT44(in_stack_00000024,in_stack_00000020));
    assertion_file_contents
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
               in_stack_00000028);
    assertion_file_contents
              (in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
               in_stack_00000028);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    assertion_chdir((char *)CONCAT44(wVar1,in_stack_fffffffffffffff8),in_stack_fffffffffffffff4,
                    pcVar3);
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_q)
{
	int r;

	/*
	 * Create an archive with several different versions of the
	 * same files.  By default, the last version will overwrite
	 * any earlier versions.  The -q/--fast-read option will
	 * stop early, so we can verify -q/--fast-read by seeing
	 * which version of each file actually ended up being
	 * extracted.  This also exercises -r mode, since that's
	 * what we use to build up the test archive.
	 */

	assertMakeFile("foo", 0644, "foo1");

	assertEqualInt(0, systemf("%s -cf archive.tar foo", testprog));

	assertMakeFile("foo", 0644, "foo2");

	assertEqualInt(0, systemf("%s -rf archive.tar foo", testprog));

	assertMakeFile("bar", 0644, "bar1");

	assertEqualInt(0, systemf("%s -rf archive.tar bar", testprog));

	assertMakeFile("foo", 0644, "foo3");

	assertEqualInt(0, systemf("%s -rf archive.tar foo", testprog));

	assertMakeFile("bar", 0644, "bar2");

	assertEqualInt(0, systemf("%s -rf archive.tar bar", testprog));

	/*
	 * Now, try extracting from the test archive with various
	 * combinations of -q.
	 */

	/* Test 1: -q foo should only extract the first foo. */
	assertMakeDir("test1", 0755);
	assertChdir("test1");
	r = systemf("%s -xf ../archive.tar -q foo >test.out 2>test.err",
	    testprog);
	failure("Fatal error trying to use -q option");
	if (!assertEqualInt(0, r))
		return;

	assertFileContents("foo1", 4, "foo");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 2: -q foo bar should extract up to the first bar. */
	assertMakeDir("test2", 0755);
	assertChdir("test2");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar -q foo bar >test.out 2>test.err", testprog));
	assertFileContents("foo2", 4, "foo");
	assertFileContents("bar1", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 3: Same as test 2, but use --fast-read spelling. */
	assertMakeDir("test3", 0755);
	assertChdir("test3");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar --fast-read foo bar >test.out 2>test.err", testprog));
	assertFileContents("foo2", 4, "foo");
	assertFileContents("bar1", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");

	/* Test 4: Without -q, should extract everything. */
	assertMakeDir("test4", 0755);
	assertChdir("test4");
	assertEqualInt(0,
	    systemf("%s -xf ../archive.tar foo bar >test.out 2>test.err", testprog));
	assertFileContents("foo3", 4, "foo");
	assertFileContents("bar2", 4, "bar");
	assertEmptyFile("test.out");
	assertEmptyFile("test.err");
	assertChdir("..");
}